

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O2

int pt_iscache_lock(pt_image_section_cache *iscache)

{
  int iVar1;
  int iVar2;
  
  if (iscache != (pt_image_section_cache *)0x0) {
    iVar1 = mtx_lock(&iscache->lock);
    iVar2 = -0x12;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    return iVar2;
  }
  return -1;
}

Assistant:

static inline int pt_iscache_lock(struct pt_image_section_cache *iscache)
{
	if (!iscache)
		return -pte_internal;

#if defined(FEATURE_THREADS)
	{
		int errcode;

		errcode = mtx_lock(&iscache->lock);
		if (errcode != thrd_success)
			return -pte_bad_lock;
	}
#endif /* defined(FEATURE_THREADS) */

	return 0;
}